

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ForwardTypedefDeclarationSyntax *pFVar1;
  Token TVar2;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  ForwardTypeRestrictionSyntax *in_stack_ffffffffffffffa0;
  Token *args_4;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = (Token *)TVar2.info;
  if (*(ForwardTypeRestrictionSyntax **)((long)__fn + 0x60) != (ForwardTypeRestrictionSyntax *)0x0)
  {
    deepClone<slang::syntax::ForwardTypeRestrictionSyntax>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForwardTypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::ForwardTypeRestrictionSyntax*,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (ForwardTypeRestrictionSyntax **)__fn,(Token *)__child_stack,args_4);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForwardTypedefDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForwardTypedefDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.typedefKeyword.deepClone(alloc),
        node.typeRestriction ? deepClone(*node.typeRestriction, alloc) : nullptr,
        node.name.deepClone(alloc),
        node.semi.deepClone(alloc)
    );
}